

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void sendEventToWM(_GLFWwindow *window,Atom type,long a,long b,long c,long d,long e)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  XEvent event;
  undefined4 local_f0 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_f0,0,0xc0);
  local_f0[0] = 0x21;
  local_d0 = *(undefined8 *)(local_8 + 0x340);
  local_c0 = 0x20;
  local_c8 = local_10;
  local_b8 = local_18;
  local_b0 = local_20;
  local_a8 = local_28;
  local_a0 = local_30;
  XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,local_f0);
  return;
}

Assistant:

static void sendEventToWM(_GLFWwindow* window, Atom type,
                          long a, long b, long c, long d, long e)
{
    XEvent event;
    memset(&event, 0, sizeof(event));

    event.type = ClientMessage;
    event.xclient.window = window->x11.handle;
    event.xclient.format = 32; // Data is 32-bit longs
    event.xclient.message_type = type;
    event.xclient.data.l[0] = a;
    event.xclient.data.l[1] = b;
    event.xclient.data.l[2] = c;
    event.xclient.data.l[3] = d;
    event.xclient.data.l[4] = e;

    XSendEvent(_glfw.x11.display, _glfw.x11.root,
               False,
               SubstructureNotifyMask | SubstructureRedirectMask,
               &event);
}